

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

DistExpression * __thiscall
slang::BumpAllocator::
emplace<slang::ast::DistExpression,slang::ast::Type_const&,slang::ast::Expression_const&,std::span<slang::ast::DistExpression::DistItem,18446744073709551615ul>,std::optional<slang::ast::DistExpression::DistWeight>&,slang::SourceRange>
          (BumpAllocator *this,Type *args,Expression *args_1,
          span<slang::ast::DistExpression::DistItem,_18446744073709551615UL> *args_2,
          optional<slang::ast::DistExpression::DistWeight> *args_3,SourceRange *args_4)

{
  optional<slang::ast::DistExpression::DistWeight> defaultWeight;
  SourceRange sourceRange;
  DistExpression *this_00;
  undefined8 *in_RCX;
  long in_R8;
  SourceLocation in_R9;
  size_t in_stack_ffffffffffffff78;
  size_t in_stack_ffffffffffffff80;
  BumpAllocator *in_stack_ffffffffffffff88;
  
  this_00 = (DistExpression *)
            allocate(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  defaultWeight.super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>._M_payload.
  super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._16_8_ = *in_RCX;
  defaultWeight.super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>._M_payload.
  super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_payload =
       *(_Storage<slang::ast::DistExpression::DistWeight,_true> *)(in_R8 + 8);
  sourceRange.endLoc = in_R9;
  sourceRange.startLoc = *(SourceLocation *)(in_RCX + 1);
  slang::ast::DistExpression::DistExpression
            (this_00,*(Type **)((long)in_R9 + 8),*(Expression **)in_R9,
             *(span<slang::ast::DistExpression::DistItem,_18446744073709551615UL> *)in_R9,
             defaultWeight,sourceRange);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }